

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O0

int buzzmu(monst *mtmp,attack *mattk)

{
  byte bVar1;
  xchar sx;
  xchar sy;
  boolean bVar2;
  byte bVar3;
  int iVar4;
  int dy;
  char *pcVar5;
  attack *mattk_local;
  monst *mtmp_local;
  
  if (10 < mattk->adtyp) {
    return 0;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0) {
    cursetxt(mtmp,'\0');
    return 0;
  }
  bVar2 = lined_up(mtmp);
  if (bVar2 == '\0') {
    return 1;
  }
  iVar4 = rn2(3);
  if (iVar4 == 0) {
    return 1;
  }
  nomul(0,(char *)0x0);
  if (mattk->adtyp == '\0') {
    return 1;
  }
  if (10 < mattk->adtyp) {
    return 1;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_002134a2;
      bVar3 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x002133dd;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
joined_r0x002133dd:
    if (bVar3 == 0) goto LAB_002134a2;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    pcVar5 = Monnam(mtmp);
    pline("%s zaps you with a %s!",pcVar5,flash_types[(int)(mattk->adtyp + 9)]);
  }
LAB_002134a2:
  bVar3 = mattk->adtyp;
  bVar1 = mattk->damn;
  sx = mtmp->mx;
  sy = mtmp->my;
  iVar4 = sgn((int)tbx);
  dy = sgn((int)tby);
  buzz(-(bVar3 + 9),(uint)bVar1,sx,sy,iVar4,dy);
  return 1;
}

Assistant:

int buzzmu(struct monst *mtmp, const struct attack  *mattk)
{
	/* don't print constant stream of curse messages for 'normal'
	   spellcasting monsters at range */
	if (mattk->adtyp > AD_SPC2)
	    return 0;

	if (mtmp->mcan) {
	    cursetxt(mtmp, FALSE);
	    return 0;
	}
	if (lined_up(mtmp) && rn2(3)) {
	    nomul(0, NULL);
	    if (mattk->adtyp && (mattk->adtyp < 11)) { /* no cf unsigned >0 */
		if (canseemon(level, mtmp))
		    pline("%s zaps you with a %s!", Monnam(mtmp),
			  flash_types[ad_to_typ(mattk->adtyp)]);
		buzz(-ad_to_typ(mattk->adtyp), (int)mattk->damn,
		     mtmp->mx, mtmp->my, sgn(tbx), sgn(tby));
	    }
	}
	return 1;
}